

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cliloader.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var_03;
  ssize_t sVar4;
  char *pcVar5;
  size_t sVar6;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  long *plVar7;
  pointer pcVar8;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  char **ppcVar9;
  size_type *psVar10;
  string *unaff_RBX;
  int iVar11;
  uint uVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *unaff_RBP;
  char *value;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *unaff_R13;
  char **unaff_R14;
  string libPath;
  string path;
  string ld_library_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string ld_preload;
  char *local_4d0;
  string local_4c8;
  char *local_4a8;
  ulong local_4a0;
  undefined1 local_498 [32];
  string local_478;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_458 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_448;
  string local_438 [32];
  
  if (argc < 2) {
    local_4a0 = 0;
    argv = unaff_R14;
  }
  else {
    unaff_RBX = (string *)(ulong)(uint)argc;
    unaff_RBP = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x1;
    local_4a0 = 0;
    local_4a8 = "1";
    local_4d0 = (char *)0x0;
    do {
      iVar11 = (int)unaff_RBP;
      unaff_R13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(long)iVar11;
      pcVar5 = argv[(long)unaff_R13];
      iVar3 = strcmp(pcVar5,"--debug");
      if (iVar3 == 0) {
        debug = true;
      }
      else {
        iVar3 = strcmp(pcVar5,"--controls");
        pcVar1 = controls.super__Vector_base<cliControl,_std::allocator<cliControl>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (iVar3 == 0) {
          if (controls.super__Vector_base<cliControl,_std::allocator<cliControl>_>._M_impl.
              super__Vector_impl_data._M_start !=
              controls.super__Vector_base<cliControl,_std::allocator<cliControl>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            ppcVar9 = &(controls.super__Vector_base<cliControl,_std::allocator<cliControl>_>._M_impl
                        .super__Vector_impl_data._M_start)->Description;
            do {
              if (((cliControl *)(ppcVar9 + -3))->IsSeparator == true) {
                puts(ppcVar9[-2]);
                puts("========================================\n");
              }
              else {
                printf("%s (%s):\n",ppcVar9[-2],ppcVar9[-1]);
                printf("%s\n\n",*ppcVar9);
              }
              pcVar8 = (pointer)(ppcVar9 + 1);
              ppcVar9 = ppcVar9 + 4;
            } while (pcVar8 != pcVar1);
            return 1;
          }
          return 1;
        }
        iVar3 = strcmp(pcVar5,"--metrics");
        if (iVar3 == 0) {
          MetricsDiscovery::printMetricsHelper(false);
          return 1;
        }
        iVar3 = strcmp(pcVar5,"--mdapi-devices");
        if (iVar3 == 0) {
          MetricsDiscovery::printMetricsHelper(true);
          return 1;
        }
        iVar3 = strcmp(pcVar5,"--no-LD_PRELOAD");
        if (iVar3 == 0) {
          set_LD_PRELOAD = false;
        }
        else {
          iVar3 = strcmp(pcVar5,"--no-LD_LIBRARY_PATH");
          if (iVar3 == 0) {
            set_LD_LIBRARY_PATH = false;
          }
          else {
            iVar3 = strcmp(pcVar5,"-q");
            if ((iVar3 == 0) || (iVar3 = strcmp(pcVar5,"--quiet"), iVar3 == 0)) {
              pcVar5 = "CLI_SuppressLogging";
LAB_00105aff:
              value = "1";
            }
            else {
              iVar3 = strcmp(pcVar5,"-c");
              if ((iVar3 == 0) || (iVar3 = strcmp(pcVar5,"--call-logging"), iVar3 == 0)) {
                pcVar5 = "CLI_CallLogging";
                goto LAB_00105aff;
              }
              iVar3 = strcmp(pcVar5,"-e");
              if ((iVar3 == 0) || (iVar3 = strcmp(pcVar5,"--error-logging"), iVar3 == 0)) {
                pcVar5 = "CLI_ErrorLogging";
                goto LAB_00105aff;
              }
              iVar3 = strcmp(pcVar5,"--tid");
              if (iVar3 == 0) {
                pcVar5 = "CLI_CallLoggingThreadId";
                goto LAB_00105aff;
              }
              iVar3 = strcmp(pcVar5,"--appendpid");
              if (iVar3 == 0) {
                pcVar5 = "CLI_AppendPid";
                goto LAB_00105aff;
              }
              iVar3 = strcmp(pcVar5,"--demangle");
              if (iVar3 == 0) {
                pcVar5 = "CLI_DemangleKernelNames";
                goto LAB_00105aff;
              }
              iVar3 = strcmp(pcVar5,"-dsrc");
              if ((iVar3 == 0) || (iVar3 = strcmp(pcVar5,"--dump-source"), iVar3 == 0)) {
                pcVar5 = "CLI_DumpProgramSource";
                goto LAB_00105aff;
              }
              iVar3 = strcmp(pcVar5,"-dspv");
              if ((iVar3 == 0) || (iVar3 = strcmp(pcVar5,"--dump-spirv"), iVar3 == 0)) {
                pcVar5 = "CLI_DumpProgramSPIRV";
                goto LAB_00105aff;
              }
              iVar3 = strcmp(pcVar5,"--dump-output-binaries");
              if (iVar3 == 0) {
                pcVar5 = "CLI_DumpProgramBinaries";
                goto LAB_00105aff;
              }
              iVar3 = strcmp(pcVar5,"--dump-kernel-isa-binaries");
              if (iVar3 == 0) {
                pcVar5 = "CLI_DumpKernelISABinaries";
                goto LAB_00105aff;
              }
              iVar3 = strcmp(pcVar5,"-d");
              if ((iVar3 == 0) || (iVar3 = strcmp(pcVar5,"--device-timing"), iVar3 == 0)) {
                pcVar5 = "CLI_DevicePerformanceTiming";
                goto LAB_00105aff;
              }
              iVar3 = strcmp(pcVar5,"-dv");
              if ((iVar3 == 0) || (iVar3 = strcmp(pcVar5,"--device-timing-verbose"), iVar3 == 0)) {
                checkSetEnv("CLI_DevicePerformanceTiming","1");
                checkSetEnv("CLI_DevicePerformanceTimeKernelInfoTracking","1");
                checkSetEnv("CLI_DevicePerformanceTimeGWSTracking","1");
                checkSetEnv("CLI_DevicePerformanceTimeLWSTracking","1");
                pcVar5 = "CLI_DevicePerformanceTimeTransferTracking";
                goto LAB_00105bac;
              }
              iVar3 = strcmp(pcVar5,"-ccl");
              if ((iVar3 == 0) || (iVar3 = strcmp(pcVar5,"--chrome-call-logging"), iVar3 == 0)) {
                pcVar5 = "CLI_ChromeCallLogging";
                goto LAB_00105aff;
              }
              iVar3 = strcmp(pcVar5,"-cdt");
              if ((iVar3 == 0) || (iVar3 = strcmp(pcVar5,"--chrome-device-timeline"), iVar3 == 0)) {
                pcVar5 = "CLI_ChromePerformanceTiming";
                goto LAB_00105aff;
              }
              iVar3 = strcmp(pcVar5,"-ckt");
              if ((iVar3 == 0) || (iVar3 = strcmp(pcVar5,"--chrome-kernel-timeline"), iVar3 == 0)) {
                checkSetEnv("CLI_ChromePerformanceTiming","1");
                pcVar5 = "CLI_ChromePerformanceTimingPerKernel";
LAB_00105bac:
                value = "1";
              }
              else {
                iVar3 = strcmp(pcVar5,"-cds");
                if ((iVar3 == 0) || (iVar3 = strcmp(pcVar5,"--chrome-device-stages"), iVar3 == 0)) {
                  checkSetEnv("CLI_ChromePerformanceTiming","1");
                  pcVar5 = "CLI_ChromePerformanceTimingInStages";
                  goto LAB_00105bac;
                }
                iVar3 = strcmp(pcVar5,"--driver-diagnostics");
                if ((iVar3 != 0) && (iVar3 = strcmp(pcVar5,"-ddiag"), iVar3 != 0)) {
                  iVar3 = strcmp(pcVar5,"--mdapi-ebs");
                  if (iVar3 != 0) {
                    iVar3 = strcmp(pcVar5,"--mdapi-tbs");
                    if (iVar3 == 0) {
                      if (local_4d0 == (char *)0x0) {
                        local_4d0 = "ComputeBasic";
                      }
                      pcVar5 = "CLI_DevicePerfCounterTimeBasedSampling";
                      goto LAB_00105aff;
                    }
                    iVar3 = strcmp(pcVar5,"--mdapi-group");
                    if (iVar3 == 0) {
                      iVar11 = iVar11 + 1;
                      if (iVar11 < argc) {
                        local_4d0 = argv[iVar11];
                      }
                    }
                    else {
                      iVar3 = strcmp(pcVar5,"--mdapi-device");
                      if (iVar3 != 0) {
                        iVar3 = strcmp(pcVar5,"-h");
                        if ((iVar3 == 0) || (iVar3 = strcmp(pcVar5,"--host-timing"), iVar3 == 0)) {
                          pcVar5 = "CLI_HostPerformanceTiming";
                        }
                        else {
                          iVar3 = strcmp(pcVar5,"-l");
                          if ((iVar3 != 0) && (iVar3 = strcmp(pcVar5,"--leak-checking"), iVar3 != 0)
                             ) {
                            iVar3 = strcmp(pcVar5,"--capture-enqueue");
                            if (iVar3 == 0) {
                              iVar11 = iVar11 + 1;
                              if (iVar11 < argc) {
                                checkSetEnv("CLI_CaptureReplay","1");
                                checkSetEnv("CLI_InitializeBuffers","1");
                                checkSetEnv("CLI_AppendBuildOptions","-cl-kernel-arg-info");
                                checkSetEnv("CLI_CaptureReplayMinEnqueue",argv[iVar11]);
                                value = argv[iVar11];
                                pcVar5 = "CLI_CaptureReplayMaxEnqueue";
                                goto LAB_00105b06;
                              }
                            }
                            else {
                              iVar3 = strcmp(pcVar5,"--capture-kernel");
                              if (iVar3 == 0) {
                                iVar11 = iVar11 + 1;
                                if (iVar11 < argc) {
                                  checkSetEnv("CLI_CaptureReplay","1");
                                  checkSetEnv("CLI_InitializeBuffers","1");
                                  checkSetEnv("CLI_AppendBuildOptions","-cl-kernel-arg-info");
                                  checkSetEnv("CLI_CaptureReplayKernelName",argv[iVar11]);
                                  pcVar5 = "CLI_CaptureReplayNumKernelEnqueuesCapture";
                                  goto LAB_00105bac;
                                }
                              }
                              else {
                                iVar3 = strcmp(pcVar5,"-f");
                                if ((iVar3 == 0) ||
                                   (iVar3 = strcmp(pcVar5,"--output-to-file"), iVar3 == 0)) {
                                  checkSetEnv("CLI_LogToFile","1");
                                  local_4a8 = "0";
                                }
                                else {
                                  iVar3 = strcmp(pcVar5,"--dump-dir");
                                  if (iVar3 == 0) {
                                    iVar11 = iVar11 + 1;
                                    if (iVar11 < argc) {
                                      value = argv[iVar11];
                                      pcVar5 = "CLI_DumpDir";
                                      goto LAB_00105b06;
                                    }
                                  }
                                  else {
                                    if (*pcVar5 != '-') goto LAB_00106377;
                                    local_4a0 = CONCAT71((int7)(CONCAT44(extraout_var_03,iVar3) >> 8
                                                               ),1);
                                  }
                                }
                              }
                            }
                            goto LAB_00105b0b;
                          }
                          pcVar5 = "CLI_LeakChecking";
                        }
                        goto LAB_00105aff;
                      }
                      iVar11 = iVar11 + 1;
                      if (iVar11 < argc) {
                        value = argv[iVar11];
                        pcVar5 = "CLI_DevicePerfCounterAdapterIndex";
                        goto LAB_00105b06;
                      }
                    }
                    goto LAB_00105b0b;
                  }
                  if (local_4d0 == (char *)0x0) {
                    local_4d0 = "ComputeBasic";
                  }
                  checkSetEnv("CLI_DevicePerfCounterEventBasedSampling","1");
                  pcVar5 = "CLI_DevicePerfCounterTiming";
                  goto LAB_00105bac;
                }
                checkSetEnv("CLI_ContextCallbackLogging","1");
                pcVar5 = "CLI_ContextHintLevel";
                value = "7";
              }
            }
LAB_00105b06:
            checkSetEnv(pcVar5,value);
          }
        }
      }
LAB_00105b0b:
      unaff_RBP = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(ulong)(iVar11 + 1U);
    } while ((int)(iVar11 + 1U) < argc);
  }
  do {
    if (((local_4a0 & 1) != 0) || (appArgs == (char **)0x0)) {
      local_438[0]._M_string_length = 0;
      local_438[0].field_2._M_local_buf[0] = '\0';
      local_438[0]._M_dataplus._M_p = (pointer)&local_438[0].field_2;
      pcVar5 = getenv("HOME");
      strlen(pcVar5);
      std::__cxx11::string::_M_replace((ulong)local_438,0,(char *)0x0,(ulong)pcVar5);
      std::__cxx11::string::append((char *)local_438);
      std::__cxx11::string::append((char *)local_438);
      std::__cxx11::string::append((char *)local_438);
      printf("cliloader - A utility to simplify using the Intercept Layer for OpenCL Applications\n  Version: %s%s%s\n\nUsage: cliloader [OPTIONS] COMMAND\n\nOptions:\n  --debug                          Enable cliloader Debug Messages\n  --controls                       Print All Controls and Exit\n  --metrics                        Print All MDAPI Metrics and Exit\n  --mdapi-devices                  Print All MDAPI Devices and Exit\n  --no-LD_PRELOAD                  Do not set LD_PRELOAD\n  --no-LD_LIBRARY_PATH             Do not set LD_LIBRARY_PATH\n\n  --quiet [-q]                     Disable Logging\n  --call-logging [-c]              Trace Host API Calls\n  --error-logging [-e]             Detect and Log API Errors\n  --tid                            Include Thread ID in the API Call Log\n  --appendpid                      Include Process ID in the Dump Directory\n  --demangle                       Demangle Kernel Names\n  --dump-source [-dsrc]            Dump Input Program Source\n  --dump-spirv [-dspv]             Dump Input Program IL (SPIR-V)\n  --dump-output-binaries           Dump Output Program Binaries\n  --dump-kernel-isa-binaries       Dump Kernel ISA Binaries (Intel GPU Only)\n  --device-timing [-d]             Report Device Execution Time\n  --device-timing-verbose [-dv]    Report More Detailed Device Execution Time\n  --chrome-call-logging [-ccl]     Record Host API Calls to a JSON Trace File\n  --chrome-device-timeline [-cdt]  Record Per-Queue Device Timeline to a JSON Trace File\n  --chrome-kernel-timeline [-ckt]  Record Per-Kernel Device Timeline to a JSON Trace File\n  --chrome-device-stages [-cds]    Record Device Timeline Stages to a JSON Trace File\n  --driver-diagnostics [-ddiag]    Log Driver Diagnostics\n  --mdapi-ebs                      Report Event-Based MDAPI Metrics (Intel GPU Only)\n  --mdapi-tbs                      Report Time-Based MDAPI Metrics (Intel GPU Only)\n  --mdapi-group <NAME>             Choose MDAPI Metrics to Collect (Intel GPU Only)\n  --mdapi-device <INDEX>           Choose MDAPI Device for Metrics (Intel GP..." /* TRUNCATED STRING LITERAL */
             ,"v3.0.6",", from ","refs/heads/main",local_438[0]._M_dataplus._M_p,
             "https://github.com/intel/opencl-intercept-layer");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438[0]._M_dataplus._M_p != &local_438[0].field_2) {
        operator_delete(local_438[0]._M_dataplus._M_p);
      }
      return 1;
    }
    sVar4 = readlink("/proc/self/exe",(char *)local_438,0x3ff);
    if (sVar4 == 0) {
      main_cold_5();
    }
    else {
      *(undefined1 *)((long)&local_438[0]._M_dataplus._M_p + sVar4) = 0;
      if (debug == true) {
        fprintf(_stderr,"[cliloader debug] full path to executable is: %s\n",local_438);
      }
      pcVar5 = strrchr((char *)local_438,0x2f);
      if (pcVar5 != (char *)0x0) {
        if (debug == true) {
          fprintf(_stderr,"[cliloader debug] pProcessName is non-NULL: %s\n",pcVar5);
        }
        *pcVar5 = '\0';
      }
      if (debug == true) {
        fprintf(_stderr,"[cliloader debug] process directory is %s\n",local_438);
      }
      argv = (char **)(local_498 + 0x10);
      unaff_RBX = local_438;
      local_498._0_8_ = argv;
      sVar6 = strlen((char *)unaff_RBX);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_498,unaff_RBX,(long)&local_438[0]._M_dataplus._M_p + sVar6);
      if ((set_LD_PRELOAD != false) || (set_LD_LIBRARY_PATH == true)) {
        local_438[0]._M_string_length = 0;
        local_438[0].field_2._M_local_buf[0] = '\0';
        local_478._M_string_length = 0;
        local_478.field_2._M_local_buf[0] = '\0';
        local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
        local_438[0]._M_dataplus._M_p = (pointer)&local_438[0].field_2;
        bVar2 = getEnvVars((string *)local_498,local_438,&local_478);
        unaff_RBX = (string *)(CONCAT71(extraout_var,bVar2) & 0xffffffff);
        if (!bVar2) {
          unaff_R13 = &local_4c8.field_2;
          local_4c8._M_dataplus._M_p = (pointer)unaff_R13;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_4c8,local_498._0_8_,
                     (pointer)(local_498._0_8_ + local_498._8_8_));
          std::__cxx11::string::append((char *)&local_4c8);
          bVar2 = getEnvVars(&local_4c8,local_438,&local_478);
          unaff_RBX = (string *)(CONCAT71(extraout_var_00,bVar2) & 0xffffffff);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4c8._M_dataplus._M_p != unaff_R13) {
            operator_delete(local_4c8._M_dataplus._M_p);
          }
        }
        if ((char)unaff_RBX == '\0') {
          unaff_R13 = &local_448;
          local_458[0] = unaff_R13;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_458,local_498._0_8_,
                     (pointer)(local_498._0_8_ + local_498._8_8_));
          std::__cxx11::string::append((char *)local_458);
          plVar7 = (long *)std::__cxx11::string::append((char *)local_458);
          unaff_RBP = &local_4c8.field_2;
          local_4c8._M_dataplus._M_p = (pointer)*plVar7;
          psVar10 = (size_type *)(plVar7 + 2);
          if ((size_type *)local_4c8._M_dataplus._M_p == psVar10) {
            local_4c8.field_2._M_allocated_capacity = *psVar10;
            local_4c8.field_2._8_8_ = plVar7[3];
            local_4c8._M_dataplus._M_p = (pointer)unaff_RBP;
          }
          else {
            local_4c8.field_2._M_allocated_capacity = *psVar10;
          }
          local_4c8._M_string_length = plVar7[1];
          *plVar7 = (long)psVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          if (local_458[0] != unaff_R13) {
            operator_delete(local_458[0]);
          }
          bVar2 = getEnvVars(&local_4c8,local_438,&local_478);
          unaff_RBX = (string *)(CONCAT71(extraout_var_01,bVar2) & 0xffffffff);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4c8._M_dataplus._M_p != unaff_RBP) {
            operator_delete(local_4c8._M_dataplus._M_p);
          }
        }
        if ((char)unaff_RBX == '\0') {
          unaff_R13 = &local_4c8.field_2;
          local_4c8._M_dataplus._M_p = (pointer)unaff_R13;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_4c8,local_498._0_8_,
                     (pointer)(local_498._0_8_ + local_498._8_8_));
          std::__cxx11::string::append((char *)&local_4c8);
          bVar2 = getEnvVars(&local_4c8,local_438,&local_478);
          unaff_RBX = (string *)(CONCAT71(extraout_var_02,bVar2) & 0xffffffff);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4c8._M_dataplus._M_p != unaff_R13) {
            operator_delete(local_4c8._M_dataplus._M_p);
          }
        }
        if ((char)unaff_RBX == '\0') {
          if (debug == true) {
            main_cold_1();
          }
        }
        else {
          if (set_LD_PRELOAD == true) {
            if (debug == true) {
              main_cold_2();
            }
            setenv("LD_PRELOAD",local_438[0]._M_dataplus._M_p,1);
          }
          if (set_LD_LIBRARY_PATH == true) {
            if (debug == true) {
              main_cold_3();
            }
            setenv("LD_LIBRARY_PATH",local_478._M_dataplus._M_p,1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_478._M_dataplus._M_p != &local_478.field_2) {
          operator_delete(local_478._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438[0]._M_dataplus._M_p != &local_438[0].field_2) {
          operator_delete(local_438[0]._M_dataplus._M_p);
        }
      }
      iVar3 = execvp(*appArgs,appArgs);
      if (iVar3 != -1) {
        if ((char **)local_498._0_8_ != argv) {
          operator_delete((void *)local_498._0_8_);
        }
        return 0;
      }
    }
    main_cold_4();
LAB_00106377:
    if (local_4d0 != (char *)0x0) {
      checkSetEnv("CLI_DevicePerfCounterCustom",local_4d0);
    }
    if (local_4a8 != (char *)0x0) {
      checkSetEnv("CLI_ReportToStderr",local_4a8);
    }
    iVar3 = (int)unaff_RBX;
    uVar12 = (uint)unaff_RBP;
    ppcVar9 = (char **)malloc((long)(int)(iVar3 - uVar12) * 8 + 8);
    appArgs = ppcVar9;
    if (iVar3 - uVar12 != 0 && (int)uVar12 <= iVar3) {
      unaff_RBP = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(ulong)(~uVar12 + iVar3);
      memcpy(ppcVar9,argv + (long)unaff_R13,(long)unaff_RBP * 8 + 8);
    }
    ppcVar9[(int)(iVar3 - uVar12)] = (char *)0x0;
  } while( true );
}

Assistant:

static bool parseArguments(int argc, char *argv[])
{
    // Defer setting these controls, since they may be overridden by explicit options.
    const char* mdapiGroup = NULL;
    const char* reportToStderr = "1";

    bool    unknownOption = false;

    for (int i = 1; i < argc; i++)
    {
        if( !strcmp(argv[i], "--debug") )
        {
            debug = true;
        }
        else if (!strcmp(argv[i], "--controls") )
        {
            printControls();
            return false;
        }
        else if (!strcmp(argv[i], "--metrics"))
        {
            printMetrics();
            return false;
        }
        else if (!strcmp(argv[i], "--mdapi-devices"))
        {
            printMetricDevices();
            return false;
        }
#if defined(_WIN32)
        else if( !strcmp(argv[i], "--no-DLL-load") )
        {
            do_DLL_load = false;
        }
#else // not Windows
        else if( !strcmp(argv[i], "--no-LD_PRELOAD") )
        {
            set_LD_PRELOAD = false;
        }
        else if( !strcmp(argv[i], "--no-LD_LIBRARY_PATH") )
        {
            set_LD_LIBRARY_PATH = false;
        }
#endif
        else if( !strcmp(argv[i], "-q") || !strcmp(argv[i], "--quiet") )
        {
            checkSetEnv("CLI_SuppressLogging", "1");
        }
        else if( !strcmp(argv[i], "-c") || !strcmp(argv[i], "--call-logging") )
        {
            checkSetEnv("CLI_CallLogging", "1");
        }
        else if( !strcmp(argv[i], "-e") || !strcmp(argv[i], "--error-logging") )
        {
            checkSetEnv("CLI_ErrorLogging", "1");
        }
        else if( !strcmp(argv[i], "--tid") )
        {
            checkSetEnv("CLI_CallLoggingThreadId", "1");
        }
        else if( !strcmp(argv[i], "--appendpid") )
        {
            checkSetEnv("CLI_AppendPid", "1");
        }
        else if( !strcmp(argv[i], "--demangle") )
        {
            checkSetEnv("CLI_DemangleKernelNames", "1");
        }
        else if( !strcmp(argv[i], "-dsrc") || !strcmp(argv[i], "--dump-source") )
        {
            checkSetEnv("CLI_DumpProgramSource", "1");
        }
        else if( !strcmp(argv[i], "-dspv") || !strcmp(argv[i], "--dump-spirv") )
        {
            checkSetEnv("CLI_DumpProgramSPIRV", "1");
        }
        else if( !strcmp(argv[i], "--dump-output-binaries") )
        {
            checkSetEnv("CLI_DumpProgramBinaries", "1");
        }
        else if( !strcmp(argv[i], "--dump-kernel-isa-binaries") )
        {
            checkSetEnv("CLI_DumpKernelISABinaries", "1");
        }
        else if( !strcmp(argv[i], "-d") || !strcmp(argv[i], "--device-timing") )
        {
            checkSetEnv("CLI_DevicePerformanceTiming", "1");
        }
        else if( !strcmp(argv[i], "-dv") || !strcmp(argv[i], "--device-timing-verbose") )
        {
            checkSetEnv("CLI_DevicePerformanceTiming", "1");
            checkSetEnv("CLI_DevicePerformanceTimeKernelInfoTracking", "1");
            checkSetEnv("CLI_DevicePerformanceTimeGWSTracking", "1");
            checkSetEnv("CLI_DevicePerformanceTimeLWSTracking", "1");
            checkSetEnv("CLI_DevicePerformanceTimeTransferTracking", "1");
        }
        else if( !strcmp(argv[i], "-ccl") || !strcmp(argv[i], "--chrome-call-logging") )
        {
            checkSetEnv("CLI_ChromeCallLogging", "1");
        }
        else if( !strcmp(argv[i], "-cdt") || !strcmp(argv[i], "--chrome-device-timeline") )
        {
            checkSetEnv("CLI_ChromePerformanceTiming", "1");
        }
        else if( !strcmp(argv[i], "-ckt") || !strcmp(argv[i], "--chrome-kernel-timeline") )
        {
            checkSetEnv("CLI_ChromePerformanceTiming", "1");
            checkSetEnv("CLI_ChromePerformanceTimingPerKernel", "1");
        }
        else if( !strcmp(argv[i], "-cds") || !strcmp(argv[i], "--chrome-device-stages") )
        {
            checkSetEnv("CLI_ChromePerformanceTiming", "1");
            checkSetEnv("CLI_ChromePerformanceTimingInStages", "1");
        }
        else if( !strcmp(argv[i], "--driver-diagnostics") || !strcmp(argv[i], "-ddiag") )
        {
            checkSetEnv("CLI_ContextCallbackLogging", "1");
            checkSetEnv("CLI_ContextHintLevel", "7");    // GOOD, BAD, and NEUTRAL
        }
        else if( !strcmp(argv[i], "--mdapi-ebs") )
        {
            if( mdapiGroup == NULL )
            {
                mdapiGroup = "ComputeBasic";
            }
            checkSetEnv("CLI_DevicePerfCounterEventBasedSampling", "1" );
            checkSetEnv("CLI_DevicePerfCounterTiming", "1");
        }
        else if( !strcmp(argv[i], "--mdapi-tbs") )
        {
            if( mdapiGroup == NULL )
            {
                mdapiGroup = "ComputeBasic";
            }
            checkSetEnv("CLI_DevicePerfCounterTimeBasedSampling", "1" );
        }
        else if( !strcmp(argv[i], "--mdapi-group") )
        {
            ++i;
            if( i < argc )
            {
                mdapiGroup = argv[i];
            }
        }
        else if( !strcmp(argv[i], "--mdapi-device") )
        {
            ++i;
            if( i < argc )
            {
                checkSetEnv("CLI_DevicePerfCounterAdapterIndex", argv[i]);
            }
        }
        else if( !strcmp(argv[i], "-h") || !strcmp(argv[i], "--host-timing") )
        {
            checkSetEnv("CLI_HostPerformanceTiming", "1");
        }
        else if( !strcmp(argv[i], "-l") || !strcmp(argv[i], "--leak-checking") )
        {
            checkSetEnv("CLI_LeakChecking", "1");
        }
        else if( !strcmp(argv[i], "--capture-enqueue") )
        {
            ++i;
            if( i < argc )
            {
                checkSetEnv("CLI_CaptureReplay", "1");
                checkSetEnv("CLI_InitializeBuffers", "1");
                checkSetEnv("CLI_AppendBuildOptions", "-cl-kernel-arg-info");
                checkSetEnv("CLI_CaptureReplayMinEnqueue", argv[i]);
                checkSetEnv("CLI_CaptureReplayMaxEnqueue", argv[i]);
            }
        }
        else if( !strcmp(argv[i], "--capture-kernel") )
        {
            ++i;
            if( i < argc )
            {
                checkSetEnv("CLI_CaptureReplay", "1");
                checkSetEnv("CLI_InitializeBuffers", "1");
                checkSetEnv("CLI_AppendBuildOptions", "-cl-kernel-arg-info");
                checkSetEnv("CLI_CaptureReplayKernelName", argv[i]);
                checkSetEnv("CLI_CaptureReplayNumKernelEnqueuesCapture", "1");
            }
        }
        else if( !strcmp(argv[i], "-f") || !strcmp(argv[i], "--output-to-file") )
        {
            checkSetEnv("CLI_LogToFile", "1");
            reportToStderr = "0";
        }
        else if( !strcmp(argv[i], "--dump-dir") )
        {
            ++i;
            if( i < argc )
            {
                checkSetEnv("CLI_DumpDir", argv[i]);
            }
        }
        else if (argv[i][0] == '-')
        {
            unknownOption = true;
        }
        else
        {
            if( mdapiGroup != NULL )
            {
                checkSetEnv("CLI_DevicePerfCounterCustom", mdapiGroup);
            }
            if (reportToStderr)
            {
                checkSetEnv("CLI_ReportToStderr", reportToStderr);
            }

#if defined(_WIN32)
            getCommandLine(argv, i);
#else // not Windows
            // Build command line argv for target application:
            appArgs = (char**)malloc((argc - i + 1) * sizeof(char*));
            int offset = i;
            for (; i < argc; i++)
            {
                appArgs[i - offset] = argv[i];
            }
            appArgs[argc - offset] = NULL;
#endif
            break;
        }
    }